

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Toplex_map.h
# Opt level: O0

bool __thiscall
Gudhi::Toplex_map::maximality<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (Toplex_map *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range)

{
  size_type sVar1;
  mapped_type *this_00;
  size_type sVar2;
  shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
  local_40;
  Vertex local_30;
  key_type *local_28;
  Vertex *v;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range_local;
  Toplex_map *this_local;
  
  v = (Vertex *)vertex_range;
  vertex_range_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this;
  local_30 = best_index<std::vector<unsigned_long,std::allocator<unsigned_long>>>(this,vertex_range)
  ;
  local_28 = &local_30;
  sVar1 = std::
          unordered_map<unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
          ::count(&this->t0,local_28);
  if (sVar1 == 0) {
    this_local._7_1_ = 0;
  }
  else {
    this_00 = std::
              unordered_map<unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
              ::at(&this->t0,local_28);
    get_key<std::vector<unsigned_long,std::allocator<unsigned_long>>>
              ((Gudhi *)&local_40,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)v);
    sVar2 = std::
            unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
            ::count(this_00,(key_type *)&local_40);
    this_local._7_1_ = sVar2 != 0;
    std::
    shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>::
    ~shared_ptr(&local_40);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Toplex_map::maximality(const Input_vertex_range& vertex_range) const {
  const Vertex& v = best_index(vertex_range);
  if (!t0.count(v)) return false;
  return t0.at(v).count(get_key(vertex_range));
}